

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(int,_int,_double)>::Matches
          (OnCallSpec<void_(int,_int,_double)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<int,_int,_double>_&>::Matches
                      ((MatcherBase<const_std::tuple<int,_int,_double>_&> *)(this + 0x58),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }